

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O0

int nn_xrep_create(void *hint,nn_sockbase **sockbase)

{
  nn_sockbase_vfptr *vfptr;
  nn_xrep *in_RSI;
  nn_xrep *self;
  
  vfptr = (nn_sockbase_vfptr *)nn_alloc_(0x140c48);
  if (vfptr == (nn_sockbase_vfptr *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/reqrep/xrep.c"
            ,0x10b);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_xrep_init(in_RSI,vfptr,(void *)0x140cb7);
  (in_RSI->sockbase).vfptr = vfptr;
  return 0;
}

Assistant:

static int nn_xrep_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xrep *self;

    self = nn_alloc (sizeof (struct nn_xrep), "socket (xrep)");
    alloc_assert (self);
    nn_xrep_init (self, &nn_xrep_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}